

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint hash(char *s0,char *s1,char *s2,char *s3)

{
  uint local_2c;
  char *pcStack_28;
  uint hashval;
  char *s3_local;
  char *s2_local;
  char *s1_local;
  char *s0_local;
  
  local_2c = 0;
  for (s1_local = s0; s2_local = s1, *s1_local != '\0'; s1_local = s1_local + 1) {
    local_2c = (int)*s1_local + local_2c * 0x1f;
  }
  for (; s3_local = s2, *s2_local != '\0'; s2_local = s2_local + 1) {
    local_2c = (int)*s2_local + local_2c * 0x1f;
  }
  for (; pcStack_28 = s3, *s3_local != '\0'; s3_local = s3_local + 1) {
    local_2c = (int)*s3_local + local_2c * 0x1f;
  }
  for (; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
    local_2c = (int)*pcStack_28 + local_2c * 0x1f;
  }
  return local_2c % 0x5dc1;
}

Assistant:

unsigned hash(const char *s0, const char *s1, const char *s2, const char *s3)
{
    unsigned   hashval;

    for (hashval = 0; *s0 != '\0'; s0++)
        hashval = *s0 + 31*hashval;
    for (; *s1 != '\0'; s1++)
        hashval = *s1 + 31*hashval;
    for (; *s2 != '\0'; s2++)
        hashval = *s2 + 31*hashval;
    for (; *s3 != '\0'; s3++)
        hashval = *s3 + 31*hashval;

    return hashval % HASHSIZE;
}